

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_list_to_uvector_op(sexp ctx,sexp self,sexp_sint_t n,sexp etype,sexp ls)

{
  byte *pbVar1;
  sexp b;
  undefined1 x [16];
  undefined1 x_00 [16];
  char cVar2;
  byte bVar3;
  uchar uVar4;
  unsigned_short uVar5;
  int iVar6;
  sexp psVar7;
  anon_union_24768_35_b8e82fc1_for_value *paVar8;
  sexp psVar9;
  sexp_sint_t n_00;
  sexp_sint_t n_01;
  ulong n_02;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  sexp psVar13;
  sexp ctx_00;
  ulong uVar14;
  double dVar15;
  sexp res;
  sexp local_50;
  sexp local_48;
  sexp_gc_var_t local_40;
  
  if (((ulong)etype & 1) == 0) {
    psVar7 = sexp_type_exception(ctx,self,2,etype);
    return psVar7;
  }
  res = (sexp)&DAT_0000043e;
  psVar7 = self;
  psVar13 = ctx;
  sexp_listp_op(ctx,self,n,ls);
  local_40.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_40;
  uVar14 = (long)etype >> 1;
  local_40.var = &res;
  psVar7 = sexp_length_op(psVar13,psVar7,n_00,ls);
  local_50 = ctx;
  if (uVar14 == 3) {
    psVar13 = (sexp)0x0;
    res = sexp_make_bytes_op(ctx,(sexp)0x0,n_01,psVar7,(sexp)&DAT_0000043e);
  }
  else {
    psVar13 = (sexp)0x0;
    res = sexp_make_uvector_op(ctx,(sexp)0x0,n_01,etype,psVar7);
  }
  ctx_00 = local_50;
  psVar7 = (sexp)0xffffffffffffffff;
  if ((0x154UL >> (uVar14 & 0x3f) & 1) == 0) {
    if ((0x1b00UL >> (uVar14 & 0x3f) & 1) == 0) {
      psVar7 = (sexp)~(-1L << (""[uVar14] & 0x3f));
    }
    uVar11 = 0;
  }
  else {
    uVar11 = -1L << (""[uVar14] - 1 & 0x3f);
    psVar7 = (sexp)~uVar11;
  }
  n_02 = 0x3feL >> ((byte)uVar14 & 0x3f);
  psVar9 = ls;
  while( true ) {
    local_48 = self;
    if ((((ulong)psVar9 & 3) != 0) || (psVar9->tag != 6)) goto LAB_001154f1;
    b = (psVar9->value).type.name;
    if ((n_02 & 1) != 0) break;
    if (((ulong)etype & 0xfffffffffffffffc) == 0x18) {
      if ((((ulong)b & 1) == 0) &&
         ((((ulong)b & 2) != 0 || (uVar12 = b->tag - 0xb, psVar13 = (sexp)(ulong)uVar12, 3 < uVar12)
          ))) goto LAB_00115481;
    }
    else if ((((ulong)b & 1) == 0) &&
            ((((ulong)b & 2) != 0 ||
             (uVar12 = b->tag - 0xb, psVar13 = (sexp)(ulong)uVar12, 2 < uVar12))))
    goto LAB_00115481;
LAB_00115471:
    psVar9 = (psVar9->value).type.cpl;
  }
  psVar13 = (sexp)((uint)b & 3 | uVar11);
  if ((psVar13 == (sexp)0x0) && (b->tag == 0xc)) {
    if ('\0' < (b->value).flonum_bits[0]) {
LAB_0011543b:
      if (((ulong)b & 2) == 0) {
        if (b->tag == 0xc) {
          psVar13 = (sexp)((long)(b->value).flonum_bits[0] * (b->value).uvector.length);
          if (-1 < (long)psVar13) {
LAB_00115468:
            psVar13 = (b->value).type.slots;
            goto LAB_0011546c;
          }
        }
        else if (b->tag == 0xc) goto LAB_00115468;
      }
      goto LAB_00115471;
    }
  }
  else {
    if (((ulong)b & 1) == 0) {
      if ((((ulong)b & 2) != 0) || (b->tag != 0xc)) goto LAB_00115481;
      psVar13 = (sexp)((long)(b->value).flonum_bits[0] * (b->value).uvector.length);
    }
    else {
      psVar13 = (sexp)((long)b >> 1);
    }
    if ((long)uVar11 <= (long)psVar13) {
      if (((ulong)b & 1) == 0) goto LAB_0011543b;
      if ((long)b < 0) goto LAB_00115471;
      psVar13 = (sexp)((ulong)b >> 1);
LAB_0011546c:
      if (psVar13 <= psVar7) goto LAB_00115471;
    }
  }
LAB_00115481:
  res = sexp_cons_op(local_50,psVar13,n_02,(sexp)&DAT_0000003e,(sexp)&DAT_0000003e);
  x._8_8_ = local_50;
  x._0_8_ = res;
  psVar7 = sexp_make_integer(ctx_00,(sexp_lsint_t)x);
  (res->value).type.name = psVar7;
  x_00._8_8_ = local_50;
  x_00._0_8_ = res;
  psVar7 = sexp_make_integer(ctx_00,(sexp_lsint_t)x_00);
  (res->value).type.cpl = psVar7;
  res = sexp_list2(ctx_00,res,b);
  res = sexp_xtype_exception(ctx_00,local_48,"invalid uniform vector value",res);
LAB_001154f1:
  if ((((ulong)res & 3) != 0) || (res->tag != 0x13)) {
    lVar10 = 0;
    uVar11 = 0;
    for (; (((ulong)ls & 3) == 0 && (ls->tag == 6)); ls = (ls->value).type.cpl) {
      switch(uVar14) {
      case 1:
        bVar3 = '\x01' << ((byte)uVar11 & 7);
        if ((ls->value).type.name < (sexp)0x2) {
          pbVar1 = (byte *)((((res->value).type.name)->value).flonum_bits + (uVar11 >> 3) + 8);
          *pbVar1 = *pbVar1 & ~bVar3;
        }
        else {
          pbVar1 = (byte *)((((res->value).type.name)->value).flonum_bits + (uVar11 >> 3) + 8);
          *pbVar1 = *pbVar1 | bVar3;
        }
        break;
      case 2:
        cVar2 = (char)(*(uint *)&ls->value >> 1);
        psVar7 = (res->value).type.name;
        goto LAB_001156b1;
      case 3:
        cVar2 = (char)(*(uint *)&ls->value >> 1);
        psVar7 = res;
LAB_001156b1:
        (psVar7->value).flonum_bits[uVar11 + 8] = cVar2;
        break;
      case 4:
      case 5:
        *(short *)((long)&((res->value).type.name)->value + uVar11 * 2 + 8) =
             (short)(*(uint *)&ls->value >> 1);
        break;
      case 6:
        psVar7 = (ls->value).type.name;
        if (((ulong)psVar7 & 1) == 0) {
          if ((((ulong)psVar7 & 2) == 0) && (psVar7->tag == 0xc)) {
            iVar6 = (int)(psVar7->value).flonum_bits[0] * (int)(psVar7->value).uvector.length;
          }
          else {
LAB_00115798:
            iVar6 = 0;
          }
        }
        else {
LAB_0011574a:
          iVar6 = (int)((long)psVar7 >> 1);
        }
        goto LAB_0011579a;
      case 7:
        psVar7 = (ls->value).type.name;
        if (((ulong)psVar7 & 1) != 0) goto LAB_0011574a;
        if ((((ulong)psVar7 & 2) != 0) || (psVar7->tag != 0xc)) goto LAB_00115798;
        iVar6 = (int)(psVar7->value).uvector.length;
LAB_0011579a:
        *(int *)((long)&((res->value).type.name)->value + uVar11 * 4 + 8) = iVar6;
        break;
      case 8:
        psVar7 = (ls->value).type.name;
        if (((ulong)psVar7 & 1) == 0) {
          if ((((ulong)psVar7 & 2) == 0) && (psVar7->tag == 0xc)) {
            psVar7 = (sexp)((long)(psVar7->value).flonum_bits[0] * (psVar7->value).uvector.length);
          }
          else {
LAB_00115787:
            psVar7 = (sexp)0x0;
          }
        }
        else {
LAB_00115782:
          psVar7 = (sexp)((long)psVar7 >> 1);
        }
        goto LAB_00115789;
      case 9:
        psVar7 = (ls->value).type.name;
        if (((ulong)psVar7 & 1) != 0) goto LAB_00115782;
        if ((((ulong)psVar7 & 2) != 0) || (psVar7->tag != 0xc)) goto LAB_00115787;
        psVar7 = (psVar7->value).type.slots;
LAB_00115789:
        *(sexp *)((long)&((res->value).type.name)->value + uVar11 * 8 + 8) = psVar7;
        break;
      case 10:
        dVar15 = sexp_to_double(ctx_00,(ls->value).type.name);
        *(float *)((long)&((res->value).type.name)->value + uVar11 * 4 + 8) = (float)dVar15;
        break;
      case 0xb:
        dVar15 = sexp_to_double(ctx_00,(ls->value).type.name);
        *(double *)((long)&((res->value).type.name)->value + uVar11 * 8 + 8) = dVar15;
        break;
      case 0xc:
        psVar7 = (ls->value).type.name;
        if (((ulong)psVar7 & 3) == 0) {
          paVar8 = &psVar7->value;
          if (psVar7->tag != 0xe) {
            paVar8 = &ls->value;
          }
          psVar7 = (paVar8->type).name;
        }
        dVar15 = sexp_to_double(local_50,psVar7);
        ctx_00 = local_50;
        *(float *)((long)&((res->value).type.name)->value + uVar11 * 8 + 8) = (float)dVar15;
        psVar7 = (ls->value).type.name;
        psVar13 = (sexp)&DAT_00000001;
        if ((((ulong)psVar7 & 3) == 0) && (psVar7->tag == 0xe)) {
          psVar13 = (psVar7->value).type.cpl;
        }
        dVar15 = sexp_to_double(local_50,psVar13);
        *(float *)((long)&((res->value).type.name)->value + uVar11 * 8 + 0xc) = (float)dVar15;
        break;
      case 0xd:
        psVar7 = (ls->value).type.name;
        if (((ulong)psVar7 & 3) == 0) {
          paVar8 = &psVar7->value;
          if (psVar7->tag != 0xe) {
            paVar8 = &ls->value;
          }
          psVar7 = (paVar8->type).name;
        }
        dVar15 = sexp_to_double(local_50,psVar7);
        ctx_00 = local_50;
        *(double *)((long)&((res->value).type.name)->value + lVar10 + 8) = dVar15;
        psVar7 = (ls->value).type.name;
        psVar13 = (sexp)&DAT_00000001;
        if ((((ulong)psVar7 & 3) == 0) && (psVar7->tag == 0xe)) {
          psVar13 = (psVar7->value).type.cpl;
        }
        dVar15 = sexp_to_double(local_50,psVar13);
        *(double *)((long)&((res->value).type.name)->value + lVar10 + 0x10) = dVar15;
        break;
      case 0xe:
        dVar15 = sexp_to_double(ctx_00,(ls->value).type.name);
        uVar4 = sexp_double_to_quarter(dVar15);
        (((res->value).type.name)->value).flonum_bits[uVar11 + 8] = uVar4;
        break;
      case 0xf:
        dVar15 = sexp_to_double(ctx_00,(ls->value).type.name);
        uVar5 = sexp_double_to_half(dVar15);
        *(unsigned_short *)((long)&((res->value).type.name)->value + uVar11 * 2 + 8) = uVar5;
      }
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x10;
    }
  }
  (ctx_00->value).context.saves = local_40.next;
  return res;
}

Assistant:

sexp sexp_list_to_uvector_op(sexp ctx, sexp self, sexp_sint_t n, sexp etype, sexp ls) {
  long et, i;
  long long min;
  unsigned long long max;
  sexp ls2, tmp;
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, etype);
  sexp_gc_var1(res);
  if (!sexp_listp(ctx, ls)) {
    res = sexp_exceptionp(ls) ? ls
      : sexp_xtype_exception(ctx, self, "list->uvector expected a list", ls);
  } else {
    sexp_gc_preserve1(ctx, res);
    et = sexp_unbox_fixnum(etype);
    res = et == SEXP_U8 ? sexp_make_bytes(ctx, sexp_length(ctx, ls), SEXP_VOID) : sexp_make_uvector(ctx, etype, sexp_length(ctx, ls));
    if (sexp_uvector_prefix(et) == 's') {
      min = (-1LL << (sexp_uvector_element_size(et)-1));
      max = (1LL << (sexp_uvector_element_size(et)-1)) - 1LL;
    } else {
      min = 0;
      max = sexp_uvector_element_size(et) == 64 ? -1 :
        (1uLL << sexp_uvector_element_size(et)) - 1LL;
    }
    for (ls2=ls; sexp_pairp(ls2); ls2=sexp_cdr(ls2)) {
      tmp = sexp_car(ls2);
      if (
#if SEXP_USE_UNIFORM_VECTOR_LITERALS
          ((sexp_uvector_prefix(et) == 'u') || (sexp_uvector_prefix(et) == 's')) ?
#endif
          !((min == 0 && sexp_bignump(tmp) ? sexp_bignum_sign(tmp) > 0 : sexp_exact_integerp(tmp) && sexp_sint_value(tmp) >= min)
            && (sexp_sint_value(tmp) < 0 || sexp_uint_value(tmp) <= max))
#if SEXP_USE_UNIFORM_VECTOR_LITERALS
          : ((sexp_uvector_prefix(et) == 'c') ? !sexp_numberp(tmp) :
          !(sexp_exact_integerp(tmp) || sexp_realp(tmp)))
#endif
          ) {
        res = sexp_cons(ctx, SEXP_FALSE, SEXP_FALSE);
        sexp_car(res) = sexp_make_integer(ctx, min);
        sexp_cdr(res) = sexp_make_integer(ctx, max);
        res = sexp_list2(ctx, res, tmp);
        res = sexp_xtype_exception(ctx, self, "invalid uniform vector value", res);
        break;
      }
    }
    if (!sexp_exceptionp(res)) {
      for (i=0; sexp_pairp(ls); ls=sexp_cdr(ls), i++) {
#if SEXP_USE_UNIFORM_VECTOR_LITERALS
        switch (et) {
        case SEXP_U1:
          sexp_bit_set(res, i, sexp_unbox_fixnum(sexp_car(ls))); break;
        case SEXP_S8:
          ((signed char*)sexp_uvector_data(res))[i] = sexp_unbox_fixnum(sexp_car(ls)); break;
        case SEXP_U8:
#endif
          sexp_bytes_set(res, sexp_make_fixnum(i), sexp_car(ls));
#if SEXP_USE_UNIFORM_VECTOR_LITERALS
          break;
        case SEXP_S16:
          ((signed short*)sexp_uvector_data(res))[i] = sexp_unbox_fixnum(sexp_car(ls)); break;
        case SEXP_U16:
          ((unsigned short*)sexp_uvector_data(res))[i] = sexp_unbox_fixnum(sexp_car(ls)); break;
        case SEXP_S32:
          ((int32_t*)sexp_uvector_data(res))[i] = sexp_sint_value(sexp_car(ls)); break;
        case SEXP_U32:
          ((uint32_t*)sexp_uvector_data(res))[i] = sexp_uint_value(sexp_car(ls)); break;
        case SEXP_S64:
          ((int64_t*)sexp_uvector_data(res))[i] = sexp_sint_value(sexp_car(ls)); break;
        case SEXP_U64:
          ((uint64_t*)sexp_uvector_data(res))[i] = sexp_uint_value(sexp_car(ls)); break;
#if SEXP_USE_FLONUMS
#if SEXP_USE_MINI_FLOAT_UNIFORM_VECTORS
        case SEXP_F8:
          ((unsigned char*)sexp_uvector_data(res))[i] = sexp_double_to_quarter(sexp_to_double(ctx, sexp_car(ls))); break;
        case SEXP_F16:
          ((unsigned short*)sexp_uvector_data(res))[i] = sexp_double_to_half(sexp_to_double(ctx, sexp_car(ls))); break;
#endif
        case SEXP_F32:
          ((float*)sexp_uvector_data(res))[i] = sexp_to_double(ctx, sexp_car(ls)); break;
        case SEXP_F64:
          ((double*)sexp_uvector_data(res))[i] = sexp_to_double(ctx, sexp_car(ls)); break;
#endif
#if SEXP_USE_COMPLEX
        case SEXP_C64:
          ((float*)sexp_uvector_data(res))[i*2] =
            sexp_to_double(ctx, sexp_real_part(sexp_car(ls)));
          ((float*)sexp_uvector_data(res))[i*2 + 1] =
            sexp_to_double(ctx, sexp_imag_part(sexp_car(ls)));
          break;
        case SEXP_C128:
          ((double*)sexp_uvector_data(res))[i*2] =
            sexp_to_double(ctx, sexp_real_part(sexp_car(ls)));
          ((double*)sexp_uvector_data(res))[i*2 + 1] =
            sexp_to_double(ctx, sexp_imag_part(sexp_car(ls)));
          break;
#endif
        }
#endif  /* SEXP_USE_UNIFORM_VECTOR_LITERALS */
      }
    }
    sexp_gc_release1(ctx);
  }
  return res;
}